

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  unsigned_long uVar4;
  uint uVar5;
  bool bVar6;
  LayerUnion LVar7;
  unsigned_long *puVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong *puVar12;
  size_type *psVar13;
  ulong uVar14;
  int index;
  uint uVar15;
  uint uVar16;
  string err;
  Result r;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  uint local_10c;
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  undefined1 local_f8 [24];
  size_type *local_e0;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  Result *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result((Result *)&local_e0);
  validateInputCount((Result *)local_108,layer,1,2);
  local_e0 = (size_type *)local_108;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_100);
  pcVar2 = local_f8 + 8;
  if (local_100._M_p != pcVar2) {
    operator_delete(local_100._M_p,local_f8._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_e0);
  if (bVar6) {
    validateOutputCount((Result *)local_108,layer,1,1);
    local_e0 = (size_type *)local_108;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_100);
    if (local_100._M_p != pcVar2) {
      operator_delete(local_100._M_p,local_f8._8_8_ + 1);
    }
    bVar6 = Result::good((Result *)&local_e0);
    if (bVar6) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ConstantPad","");
      validateInputOutputRankEquality((Result *)local_108,layer,&local_50,&this->blobNameToRank);
      local_e0 = (size_type *)local_108;
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_100);
      if (local_100._M_p != pcVar2) {
        operator_delete(local_100._M_p,local_f8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar6 = Result::good((Result *)&local_e0);
      if (!bVar6) goto LAB_002eb31d;
      if (layer->_oneof_case_[0] == 0x483) {
        LVar7 = layer->layer_;
      }
      else {
        LVar7.constantpad_ = Specification::ConstantPaddingLayerParams::default_instance();
      }
      if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) goto LAB_002eb31d;
      uVar3 = ((LVar7.convolution_)->kernelsize_).current_size_;
      if ((uVar3 & 1) == 0) {
        if (uVar3 != 0) {
          if (((LVar7.constantpad_)->padtogivenoutputsizemode_ == true) && (0 < (int)uVar3 >> 1)) {
            index = 0;
            local_10c = 0;
            local_78 = __return_storage_ptr__;
            do {
              puVar8 = google::protobuf::RepeatedField<unsigned_long>::Get
                                 (&(LVar7.convolution_)->kernelsize_,index);
              uVar4 = *puVar8;
              puVar8 = google::protobuf::RepeatedField<unsigned_long>::Get
                                 (&(LVar7.convolution_)->kernelsize_,index + 1);
              if ((0 < (int)uVar4) && (0 < (int)*puVar8)) {
                std::operator+(&local_70,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
                __return_storage_ptr__ = local_78;
                uVar3 = local_10c;
                puVar12 = (ulong *)(plVar9 + 2);
                if ((ulong *)*plVar9 == puVar12) {
                  local_88 = *puVar12;
                  lStack_80 = plVar9[3];
                  local_98 = &local_88;
                }
                else {
                  local_88 = *puVar12;
                  local_98 = (ulong *)*plVar9;
                }
                local_90 = plVar9[1];
                *plVar9 = (long)puVar12;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                uVar16 = 1;
                if (local_10c < 10) goto LAB_002eb7f7;
                uVar15 = local_10c;
                uVar5 = 4;
                goto LAB_002eb7bb;
              }
              local_10c = local_10c + 1;
              index = index + 2;
              __return_storage_ptr__ = local_78;
            } while ((int)uVar3 >> 1 != local_10c);
          }
          goto LAB_002eb31d;
        }
        std::operator+(&local_130,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_108 = (undefined1  [8])local_f8;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar13) {
          local_f8._0_8_ = *psVar13;
          local_f8._8_8_ = plVar9[3];
        }
        else {
          local_f8._0_8_ = *psVar13;
          local_108 = (undefined1  [8])*plVar9;
        }
        local_100._M_p = (pointer)plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
      }
      else {
        std::operator+(&local_70,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
        puVar12 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar12) {
          local_88 = *puVar12;
          lStack_80 = plVar9[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *puVar12;
          local_98 = (ulong *)*plVar9;
        }
        local_90 = plVar9[1];
        *plVar9 = (long)puVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        uVar16 = -uVar3;
        if (0 < (int)uVar3) {
          uVar16 = uVar3;
        }
        uVar15 = 1;
        if (9 < uVar16) {
          uVar14 = (ulong)uVar16;
          uVar5 = 4;
          do {
            uVar15 = uVar5;
            uVar11 = (uint)uVar14;
            if (uVar11 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_002eb521;
            }
            if (uVar11 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_002eb521;
            }
            if (uVar11 < 10000) goto LAB_002eb521;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar15 + 4;
          } while (99999 < uVar11);
          uVar15 = uVar15 + 1;
        }
LAB_002eb521:
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_b8,(char)uVar15 - (char)((int)uVar3 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_b8 + (ulong)(uVar3 >> 0x1f)),uVar15,uVar16);
        uVar14 = 0xf;
        if (local_98 != &local_88) {
          uVar14 = local_88;
        }
        if (uVar14 < (ulong)(local_b0 + local_90)) {
          uVar14 = 0xf;
          if (local_b8 != local_a8) {
            uVar14 = local_a8[0];
          }
          if (uVar14 < (ulong)(local_b0 + local_90)) goto LAB_002eb5ab;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
        }
        else {
LAB_002eb5ab:
          puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8)
          ;
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_130.field_2._M_allocated_capacity = *psVar13;
          local_130.field_2._8_8_ = puVar10[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar13;
          local_130._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_130._M_string_length = puVar10[1];
        *puVar10 = psVar13;
        puVar10[1] = 0;
        *(undefined1 *)psVar13 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_108 = (undefined1  [8])local_f8;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar13) {
          local_f8._0_8_ = *psVar13;
          local_f8._8_8_ = plVar9[3];
        }
        else {
          local_f8._0_8_ = *psVar13;
          local_108 = (undefined1  [8])*plVar9;
        }
        local_100._M_p = (pointer)plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,local_a8[0] + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
      }
      goto LAB_002eb6f9;
    }
  }
LAB_002eb31d:
  *(size_type **)__return_storage_ptr__ = local_e0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p == &local_c8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_c8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_d8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  goto LAB_002eb36b;
  while( true ) {
    if (uVar15 < 10000) goto LAB_002eb7f7;
    bVar6 = uVar15 < 100000;
    uVar15 = uVar15 / 10000;
    uVar5 = uVar16 + 4;
    if (bVar6) break;
LAB_002eb7bb:
    uVar16 = uVar5;
    if (uVar15 < 100) {
      uVar16 = uVar16 - 2;
      goto LAB_002eb7f7;
    }
    if (uVar15 < 1000) {
      uVar16 = uVar16 - 1;
      goto LAB_002eb7f7;
    }
  }
  uVar16 = uVar16 + 1;
LAB_002eb7f7:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar16,uVar3);
  uVar14 = 0xf;
  if (local_98 != &local_88) {
    uVar14 = local_88;
  }
  if (uVar14 < (ulong)(local_b0 + local_90)) {
    uVar14 = 0xf;
    if (local_b8 != local_a8) {
      uVar14 = local_a8[0];
    }
    if (uVar14 < (ulong)(local_b0 + local_90)) goto LAB_002eb87a;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_002eb87a:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  psVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_130.field_2._M_allocated_capacity = *psVar13;
    local_130.field_2._8_8_ = puVar10[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar13;
    local_130._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_130._M_string_length = puVar10[1];
  *puVar10 = psVar13;
  puVar10[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_108 = (undefined1  [8])local_f8;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_f8._0_8_ = *psVar13;
    local_f8._8_8_ = plVar9[3];
  }
  else {
    local_f8._0_8_ = *psVar13;
    local_108 = (undefined1  [8])*plVar9;
  }
  local_100._M_p = (pointer)plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
LAB_002eb6f9:
  if (local_108 != (undefined1  [8])local_f8) {
    operator_delete((void *)local_108,local_f8._0_8_ + 1);
  }
LAB_002eb36b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}
    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}
    r = validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank);
    if (!r.good()) {return r;}

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}